

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)>
               (interval_t *adata,date_t *bdata,date_t *cdata,date_t *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_date_t_interval_t_date_t_date_t_ValidityMask_ptr_unsigned_long *fun)

{
  ulong *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  unsigned_long *puVar4;
  undefined4 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  date_t dVar10;
  unsigned_long uVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  unsigned_long uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  ulong uVar17;
  idx_t idx_in_entry;
  unsigned_long uVar18;
  ulong uVar19;
  interval_t iVar20;
  interval_t iVar21;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar18 = 0;
      do {
        uVar11 = uVar18;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar11 = (unsigned_long)asel->sel_vector[uVar18];
        }
        uVar14 = uVar18;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar14 = (unsigned_long)bsel->sel_vector[uVar18];
        }
        uVar16 = uVar18;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar16 = (unsigned_long)csel->sel_vector[uVar18];
        }
        uVar2 = adata[uVar11].months;
        uVar5 = adata[uVar11].days;
        iVar20.days = uVar5;
        iVar20.months = uVar2;
        iVar20.micros = adata[uVar11].micros;
        dVar10 = (*fun)(iVar20,bdata[uVar14].days,cdata[uVar16].days,result_validity,uVar18);
        result_data[uVar18].days = dVar10.days;
        uVar18 = uVar18 + 1;
      } while (count != uVar18);
    }
  }
  else if (count != 0) {
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar19 = 0;
    do {
      uVar12 = uVar19;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)asel->sel_vector[uVar19];
      }
      uVar15 = uVar19;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)bsel->sel_vector[uVar19];
      }
      uVar17 = uVar19;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar17 = (ulong)csel->sel_vector[uVar19];
      }
      puVar4 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
          && ((puVar4 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0))
             )) && ((puVar4 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar4 == (unsigned_long *)0x0 ||
                    ((puVar4[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))) {
        uVar3 = adata[uVar12].months;
        uVar6 = adata[uVar12].days;
        iVar21.days = uVar6;
        iVar21.months = uVar3;
        iVar21.micros = adata[uVar12].micros;
        dVar10 = (*fun)(iVar21,bdata[uVar15].days,cdata[uVar17].days,result_validity,uVar19);
        result_data[uVar19].days = dVar10.days;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var9 = p_Stack_50;
          peVar8 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar8;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar7 = (byte)uVar19 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar19 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      uVar19 = uVar19 + 1;
    } while (count != uVar19);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}